

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

int __thiscall
Fl_Text_Display::handle_vline
          (Fl_Text_Display *this,int mode,int lineStartPos,int lineLen,int leftChar,int rightChar,
          int Y,int bottomClip,int leftClip,int rightClip)

{
  char c;
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  uint local_90;
  char *local_80;
  int local_64;
  ulong local_58;
  
  iVar4 = 0;
  if (lineStartPos == -1) {
    local_80 = (char *)0x0;
  }
  else {
    local_80 = Fl_Text_Buffer::text_range(this->mBuffer,lineStartPos,lineLen + lineStartPos);
  }
  if (mode != 3) {
    if (mode == 2) {
      mode = 1;
    }
    else {
      iVar4 = (this->text_area).x - this->mHorizOffset;
    }
  }
  if (local_80 == (char *)0x0) {
    if (mode != 1) {
      if (mode == 0) {
        iVar2 = position_style(this,lineStartPos,lineLen,-1);
        iVar4 = (this->text_area).x;
        draw_string(this,iVar2 + 0x1000,iVar4,Y,(this->text_area).w + iVar4,(char *)0x0,lineLen);
      }
      lineStartPos = 0;
    }
  }
  else {
    local_58 = 0;
    local_90 = position_style(this,lineStartPos,lineLen,0);
    if (lineLen < 1) {
      bVar11 = false;
      iVar2 = 0;
    }
    else {
      uVar10 = 0;
      local_58 = 0;
      cVar1 = '\0';
      do {
        iVar9 = (int)uVar10;
        c = local_80[uVar10];
        iVar2 = fl_utf8len1(c);
        if (iVar2 < 2) {
          iVar2 = 1;
        }
        uVar3 = position_style(this,lineStartPos,lineLen,iVar9);
        if ((cVar1 == '\t' || uVar3 != local_90) || c == '\t') {
          iVar7 = (int)local_58;
          if (cVar1 == '\t') {
            iVar8 = this->mBuffer->mTabDist;
            if ((this->mColumnScale == 0.0) && (!NAN(this->mColumnScale))) {
              x_to_col(this,0.0);
            }
            iVar6 = (int)((double)iVar8 * this->mColumnScale);
            iVar8 = (this->mHorizOffset + iVar4) - (this->text_area).x;
            if (mode == 3) {
              iVar8 = iVar4;
            }
            iVar8 = (iVar8 / iVar6 + 1) * iVar6 - iVar8;
            bVar11 = true;
            if (mode == 1) {
              if (rightClip < iVar8 + iVar4) {
                free(local_80);
                local_64 = lineStartPos + iVar7;
                bVar11 = false;
              }
            }
            else if (mode == 0) {
              draw_string(this,local_90 | 0x1000,iVar4,Y,iVar8 + iVar4,(char *)0x0,0);
            }
            if (bVar11) goto LAB_001d2e06;
LAB_001d2dfd:
            bVar11 = false;
          }
          else {
            pcVar5 = local_80 + local_58;
            iVar6 = iVar9 - iVar7;
            dVar12 = string_width(this,pcVar5,iVar6,local_90);
            iVar8 = (int)dVar12;
            if (mode == 1) {
              if (rightClip < iVar4 + iVar8) {
                iVar8 = find_x(this,pcVar5,iVar6,local_90,rightClip - iVar4);
                free(local_80);
                local_64 = iVar8 + iVar7 + lineStartPos;
                goto LAB_001d2dfd;
              }
            }
            else if (mode == 0) {
              draw_string(this,local_90,iVar4,Y,iVar4 + iVar8,pcVar5,iVar6);
            }
LAB_001d2e06:
            iVar4 = iVar4 + iVar8;
            bVar11 = true;
            local_90 = uVar3;
            local_58 = uVar10;
          }
          if (bVar11) goto LAB_001d2e33;
          bVar11 = false;
        }
        else {
LAB_001d2e33:
          uVar10 = (ulong)(uint)(iVar9 + iVar2);
          bVar11 = true;
          cVar1 = c;
        }
        iVar2 = (int)uVar10;
        if (!bVar11) {
          return local_64;
        }
      } while (iVar2 < lineLen);
      bVar11 = c == '\t';
    }
    iVar9 = (int)local_58;
    if (bVar11) {
      iVar7 = this->mBuffer->mTabDist;
      if ((this->mColumnScale == 0.0) && (!NAN(this->mColumnScale))) {
        x_to_col(this,0.0);
      }
      iVar7 = (int)((double)iVar7 * this->mColumnScale);
      iVar8 = (this->mHorizOffset + iVar4) - (this->text_area).x;
      if (mode == 3) {
        iVar8 = iVar4;
      }
      iVar8 = (iVar8 / iVar7 + 1) * iVar7 - iVar8;
      if (mode == 0) {
        draw_string(this,local_90 | 0x1000,iVar4,Y,iVar8 + iVar4,(char *)0x0,0);
      }
      if (mode == 1) {
        free(local_80);
        return (uint)(iVar8 < rightClip - iVar4) + iVar9 + lineStartPos;
      }
    }
    else {
      pcVar5 = local_80 + local_58;
      iVar7 = iVar2 - iVar9;
      dVar12 = string_width(this,pcVar5,iVar7,local_90);
      if (mode == 1) {
        iVar4 = find_x(this,pcVar5,iVar7,local_90,rightClip - iVar4);
        free(local_80);
        return iVar9 + lineStartPos + iVar4;
      }
      iVar8 = (int)dVar12;
      if (mode == 0) {
        draw_string(this,local_90,iVar4,Y,iVar4 + iVar8,pcVar5,iVar7);
      }
    }
    if (mode == 3) {
      free(local_80);
      lineStartPos = iVar8 + iVar4;
    }
    else {
      uVar3 = position_style(this,lineStartPos,lineLen,iVar2);
      if (mode == 0) {
        draw_string(this,uVar3 | 0x1000,iVar8 + iVar4,Y,(this->text_area).w + (this->text_area).x,
                    local_80,lineLen);
      }
      free(local_80);
      lineStartPos = lineLen + lineStartPos;
    }
  }
  return lineStartPos;
}

Assistant:

int Fl_Text_Display::handle_vline(
                                  int mode,
                                  int lineStartPos, int lineLen, int leftChar, int rightChar,
                                  int Y, int bottomClip,
                                  int leftClip, int rightClip) const
{
  IS_UTF8_ALIGNED2(buffer(), lineStartPos)

  // FIXME: we need to allow two modes for FIND_INDEX: one on the edge of the
  // FIXME: character for selection, and one on the character center for cursors.
  int i, X, startX, startIndex, style, charStyle;
  char *lineStr;

  if ( lineStartPos == -1 ) {
    lineStr = NULL;
  } else {
    lineStr = mBuffer->text_range( lineStartPos, lineStartPos + lineLen );
  }

  if (mode==GET_WIDTH) {
    X = 0;
  } else if (mode==FIND_INDEX_FROM_ZERO) {
    X = 0;
    mode = FIND_INDEX;
  } else {
    X = text_area.x - mHorizOffset;
  }

  startX = X;
  startIndex = 0;
  if (!lineStr) {
    // just clear the background
    if (mode==DRAW_LINE) {
      style = position_style(lineStartPos, lineLen, -1);
      draw_string( style|BG_ONLY_MASK, text_area.x, Y, text_area.x+text_area.w, lineStr, lineLen );
    }
    if (mode==FIND_INDEX) {
      IS_UTF8_ALIGNED2(buffer(), lineStartPos)
      return lineStartPos;
    }
    return 0;
  }

  char currChar = 0, prevChar = 0;
  // draw the line
  style = position_style(lineStartPos, lineLen, 0);
  for (i=0; i<lineLen; ) {
    currChar = lineStr[i]; // one byte is enough to handele tabs and other cases
    int len = fl_utf8len1(currChar);
    if (len<=0) len = 1; // OUCH!
    charStyle = position_style(lineStartPos, lineLen, i);
    if (charStyle!=style || currChar=='\t' || prevChar=='\t') {
      // draw a segment whenever the style changes or a Tab is found
      int w = 0;
      if (prevChar=='\t') {
        // draw a single Tab space
        int tab = (int)col_to_x(mBuffer->tab_distance());
        int xAbs = (mode==GET_WIDTH) ? startX : startX+mHorizOffset-text_area.x;
        w = (((xAbs/tab)+1)*tab) - xAbs;
        if (mode==DRAW_LINE)
          draw_string( style|BG_ONLY_MASK, startX, Y, startX+w, 0, 0 );
        if (mode==FIND_INDEX && startX+w>rightClip) {
          // find x pos inside block
          free(lineStr);
          return lineStartPos + startIndex;
        }
      } else {
        // draw a text segment
        w = int( string_width( lineStr+startIndex, i-startIndex, style ) );
        if (mode==DRAW_LINE)
          draw_string( style, startX, Y, startX+w, lineStr+startIndex, i-startIndex );
        if (mode==FIND_INDEX && startX+w>rightClip) {
          // find x pos inside block
          int di = find_x(lineStr+startIndex, i-startIndex, style, rightClip-startX);
          free(lineStr);
          IS_UTF8_ALIGNED2(buffer(), (lineStartPos+startIndex+di))
          return lineStartPos + startIndex + di;
        }
      }
      style = charStyle;
      startX += w;
      startIndex = i;
    }
    i += len;
    prevChar = currChar;
  }
  int w = 0;
  if (currChar=='\t') {
    // draw a single Tab space
    int tab = (int)col_to_x(mBuffer->tab_distance());
    int xAbs = (mode==GET_WIDTH) ? startX : startX+mHorizOffset-text_area.x;
    w = (((xAbs/tab)+1)*tab) - xAbs;
    if (mode==DRAW_LINE)
      draw_string( style|BG_ONLY_MASK, startX, Y, startX+w, 0, 0 );
    if (mode==FIND_INDEX) {
      // find x pos inside block
      free(lineStr);
      return lineStartPos + startIndex + ( rightClip-startX>w ? 1 : 0 );
    }
  } else {
    w = int( string_width( lineStr+startIndex, i-startIndex, style ) );
    if (mode==DRAW_LINE)
      draw_string( style, startX, Y, startX+w, lineStr+startIndex, i-startIndex );
    if (mode==FIND_INDEX) {
      // find x pos inside block
      int di = find_x(lineStr+startIndex, i-startIndex, style, rightClip-startX);
      free(lineStr);
      IS_UTF8_ALIGNED2(buffer(), (lineStartPos+startIndex+di))
      return lineStartPos + startIndex + di;
    }
  }
  if (mode==GET_WIDTH) {
    free(lineStr);
    return startX+w;
  }

  // clear the rest of the line
  startX += w;
  style = position_style(lineStartPos, lineLen, i);
  if (mode==DRAW_LINE)
    draw_string( style|BG_ONLY_MASK, startX, Y, text_area.x+text_area.w, lineStr, lineLen );

  free(lineStr);
  IS_UTF8_ALIGNED2(buffer(), (lineStartPos+lineLen))
  return lineStartPos + lineLen;
}